

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void correctstack(lua_State *L,TValue *oldstack)

{
  UpVal *local_28;
  UpVal *up;
  CallInfo *ci;
  TValue *oldstack_local;
  lua_State *L_local;
  
  L->top = L->stack + ((long)L->top - (long)oldstack >> 4);
  for (local_28 = L->openupval; local_28 != (UpVal *)0x0; local_28 = (local_28->u).open.next) {
    local_28->v = L->stack + ((long)local_28->v - (long)oldstack >> 4);
  }
  for (up = (UpVal *)L->ci; up != (UpVal *)0x0; up = (up->u).open.next) {
    up->refcount = (lu_mem)(L->stack + ((long)(up->refcount - (long)oldstack) >> 4));
    up->v = L->stack + ((long)up->v - (long)oldstack >> 4);
    if (((ulong)up[2].v & 0x20000) != 0) {
      up[1].v = L->stack + ((long)up[1].v - (long)oldstack >> 4);
    }
  }
  return;
}

Assistant:

static void correctstack (lua_State *L, TValue *oldstack) {
  CallInfo *ci;
  UpVal *up;
  L->top = (L->top - oldstack) + L->stack;
  for (up = L->openupval; up != NULL; up = up->u.open.next)
    up->v = (up->v - oldstack) + L->stack;
  for (ci = L->ci; ci != NULL; ci = ci->previous) {
    ci->top = (ci->top - oldstack) + L->stack;
    ci->func = (ci->func - oldstack) + L->stack;
    if (isLua(ci))
      ci->u.l.base = (ci->u.l.base - oldstack) + L->stack;
  }
}